

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::Flush
          (DeviceContextVkImpl *this,Uint32 NumCommandLists,ICommandList **ppCommandLists)

{
  VulkanCommandBuffer *pVVar1;
  Uint8 *Args_2;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *pSignalFences;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  atomic<unsigned_long> *paVar2;
  byte bVar3;
  pointer ppVar4;
  FenceVkImpl *pFVar5;
  VkSemaphore_T *pVVar6;
  pointer ppVVar7;
  RenderDeviceVkImpl *pRVar8;
  pointer pRVar9;
  pointer puVar10;
  pointer puVar11;
  ulong uVar12;
  SoftwareQueueIndex SVar13;
  Uint32 UVar14;
  CommandListVkImpl *this_01;
  char (*pacVar15) [58];
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *FenceValue;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_02;
  DeviceContextVkImpl *this_03;
  char (*in_RCX) [31];
  char (*Args_1) [94];
  char (*Args_1_00) [64];
  char (*Args_1_01) [56];
  char (*Args_1_02) [58];
  char (*Args_1_03) [62];
  ulong uVar16;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *Args_1_04;
  bool bVar17;
  Uint32 i;
  ulong uVar18;
  long lVar19;
  QueryManagerVk *this_04;
  char (*in_R8) [94];
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Sem;
  pointer ppVar20;
  pointer this_05;
  long lVar21;
  long lVar22;
  pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *val_fence;
  char (*in_stack_fffffffffffff8c8) [2];
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> vkCmdBuffs;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  DeferredCtxs;
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
  *__range2;
  VkCommandBuffer vkCmdBuff;
  VkSemaphore WaitSem;
  undefined8 *puStack_6b0;
  ulong local_6a8;
  pointer ppVStack_6a0;
  pointer local_698;
  ulong uStack_690;
  pointer local_688;
  ulong uStack_680;
  pointer local_678;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *local_668;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_660;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_658;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> *local_650;
  VulkanCommandBuffer *local_648;
  pointer local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  ulong local_628;
  pointer puStack_620;
  ulong local_618;
  pointer puStack_610;
  string msg;
  
  uVar12 = (ulong)NumCommandLists;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
    FormatString<char[54]>
              (&msg,(char (*) [54])"Flush() should only be called for immediate contexts.");
    in_RCX = (char (*) [31])0x59e;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x59e);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (this->m_ActiveQueriesCounter != 0) {
    FormatString<char[34],int,char[94]>
              (&msg,(Diligent *)"Flushing device context that has ",
               (char (*) [34])&this->m_ActiveQueriesCounter,
               (int *)
               " active queries. Vulkan requires that queries are begun and ended in the same command buffer."
               ,in_R8);
    in_RCX = (char (*) [31])0x5a2;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a2);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[54]>
              (&msg,(char (*) [54])"Flushing device context inside an active render pass.");
    in_RCX = (char (*) [31])0x5a5;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a5);
    std::__cxx11::string::~string((string *)&msg);
  }
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::reserve
            (&vkCmdBuffs,uVar12 + 1);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::reserve(&DeferredCtxs,uVar12 + 1);
  pVVar1 = &this->m_CommandBuffer;
  vkCmdBuff = (this->m_CommandBuffer).m_VkCmdBuffer;
  if (vkCmdBuff != (VkCommandBuffer)0x0) {
    this_04 = this->m_pQueryMgr;
    if (this_04 == (QueryManagerVk *)0x0) {
      UVar14 = (this->m_State).NumCommands;
    }
    else {
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
        FormatString<char[26],char[14]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!IsDeferred()",
                   (char (*) [14])in_RCX);
        in_RCX = (char (*) [31])0x5b2;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5b2);
        std::__cxx11::string::~string((string *)&msg);
        this_04 = this->m_pQueryMgr;
      }
      UVar14 = QueryManagerVk::ResetStaleQueries
                         (this_04,(((this->
                                    super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                                   m_pObject)->m_LogicalVkDevice).
                                  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,pVVar1);
      UVar14 = UVar14 + (this->m_State).NumCommands;
      (this->m_State).NumCommands = UVar14;
    }
    if (UVar14 != 0) {
      EndRenderScope(this);
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount != 0) {
        FormatString<char[37]>(&msg,(char (*) [37])"Not all debug groups have been ended");
        in_RCX = (char (*) [31])0x5bd;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5bd);
        std::__cxx11::string::~string((string *)&msg);
      }
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount = 0;
      VulkanUtilities::VulkanCommandBuffer::FlushBarriers(pVVar1);
      VulkanUtilities::VulkanCommandBuffer::EndCommandBuffer(pVVar1);
      std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::push_back
                (&vkCmdBuffs,&vkCmdBuff);
    }
  }
  local_650 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass;
  Args_2 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId;
  local_648 = pVVar1;
  for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
    this_01 = ClassPtrCast<Diligent::CommandListVkImpl,Diligent::ICommandList>
                        (ppCommandLists[uVar18]);
    if (this_01 == (CommandListVkImpl *)0x0) {
      FormatString<char[30]>(&msg,(char (*) [30])"Command list must not be null");
      in_RCX = (char (*) [31])0x5cc;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5cc);
      std::__cxx11::string::~string((string *)&msg);
    }
    bVar3 = (this_01->super_CommandListBase<Diligent::EngineVkImplTraits>).m_QueueId;
    if (bVar3 != *Args_2) {
      WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,(uint)bVar3);
      FormatString<char[35],unsigned_int,char[27],unsigned_char,char[2]>
                (&msg,(Diligent *)"Command list recorded for QueueId ",(char (*) [35])&WaitSem,
                 (uint *)", but executed on QueueId ",(char (*) [27])Args_2,".",
                 in_stack_fffffffffffff8c8);
      in_RCX = (char (*) [31])0x5cd;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5cd);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
    ::emplace_back<>(&DeferredCtxs);
    std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::emplace_back<>
              (&vkCmdBuffs);
    CommandListVkImpl::Close
              (this_01,DeferredCtxs.
                       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1,
               vkCmdBuffs.
               super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl
               .super__Vector_impl_data._M_finish + -1);
    if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1] == (VkCommandBuffer_T *)0x0) {
      FormatString<char[39]>(&msg,(char (*) [39])"Trying to execute empty command buffer");
      in_RCX = (char (*) [31])0x5d1;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5d1);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (DeferredCtxs.
        super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].m_pObject == (IDeviceContext *)0x0) {
      FormatString<char[26],char[31]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DeferredCtxs.back() != nullptr",in_RCX);
      in_RCX = (char (*) [31])0x5d2;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5d2);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  Args_1 = (char (*) [94])
           ((long)(this->m_WaitManagedSemaphores).
                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_WaitManagedSemaphores).
                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((char *)((long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) !=
      *Args_1 + ((long)(this->m_WaitRecycledSemaphores).
                       super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_WaitRecycledSemaphores).
                       super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    FormatString<char[26],char[94]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size()"
               ,Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d5);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_1_00 = (char (*) [64])
              ((long)(this->m_SignalManagedSemaphores).
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_SignalManagedSemaphores).
                    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((char (*) [64])
      ((long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start) != Args_1_00) {
    FormatString<char[26],char[64]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size()",
               Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d6);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_660 = &this->m_WaitManagedSemaphores;
  local_658 = &this->m_SignalManagedSemaphores;
  pSignalFences = &this->m_SignalFences;
  ppVar4 = (this->m_SignalFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = false;
  for (ppVar20 = (this->m_SignalFences).
                 super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar4; ppVar20 = ppVar20 + 1
      ) {
    pFVar5 = (ppVar20->second).m_pObject;
    if ((pFVar5->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                (&pFVar5->super_FenceBase<Diligent::EngineVkImplTraits>,ppVar20->first);
      msg._M_dataplus._M_p = (pointer)(pFVar5->m_TimelineSemaphore).m_VkObject;
      std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
                ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                 &this->m_VkSignalSemaphores,(VkSemaphore_T **)&msg);
      bVar17 = true;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_SignalSemaphoreValues,&ppVar20->first);
    }
  }
  local_668 = &this->m_WaitFences;
  local_640 = (this->m_WaitFences).
              super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_WaitSemaphoreValues;
  for (ppVar20 = (this->m_WaitFences).
                 super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar20 != local_640;
      ppVar20 = ppVar20 + 1) {
    pFVar5 = (ppVar20->second).m_pObject;
    FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
              (&pFVar5->super_FenceBase<Diligent::EngineVkImplTraits>,ppVar20->first);
    pVVar6 = (pFVar5->m_TimelineSemaphore).m_VkObject;
    if (pVVar6 == (VkSemaphore_T *)0x0) {
      SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      FenceVkImpl::ExtractSignalSemaphore
                ((VulkanRecycledSemaphore *)&msg,pFVar5,SVar13,ppVar20->first);
      if (msg.field_2._M_allocated_capacity != 0) {
        WaitSem = (VkSemaphore)msg.field_2._M_allocated_capacity;
        std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
                  ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                   &this->m_VkWaitSemaphores,&WaitSem);
        WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,0x10000);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this->m_WaitDstStageMasks,(uint *)&WaitSem);
        std::
        vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
        ::
        emplace_back<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
                  ((vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
                    *)&this->m_WaitRecycledSemaphores,
                   (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg);
        WaitSem = (VkSemaphore)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (this_00,(unsigned_long *)&WaitSem);
      }
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg);
    }
    else {
      lVar22 = 0;
      WaitSem = pVVar6;
      for (uVar18 = 0;
          ppVVar7 = (this->m_VkWaitSemaphores).
                    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar18 < (ulong)((long)(this->m_VkWaitSemaphores).
                                 super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar7 >> 3);
          uVar18 = uVar18 + 1) {
        if (*(VkSemaphore *)((long)ppVVar7 + lVar22) == WaitSem) {
          FormatString<char[8],char_const*,char[15],unsigned_long,char[50],unsigned_long,char[2]>
                    (&msg,(Diligent *)"Fence \'",
                     (char (*) [8])
                     &(pFVar5->super_FenceBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                      .m_Desc,(char **)"\' with value (",(char (*) [15])ppVar20,
                     (unsigned_long *)") is already added to wait operation with value (",
                     (char (*) [50])
                     ((long)(this_00->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar22),
                     (unsigned_long *)0x647201,in_stack_fffffffffffff8c8);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
        }
        lVar22 = lVar22 + 8;
      }
      std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                (&this->m_VkWaitSemaphores,&WaitSem);
      msg._M_dataplus._M_p._0_4_ = 0x10000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->m_WaitDstStageMasks,(uint *)&msg);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&ppVar20->first)
      ;
      bVar17 = true;
    }
  }
  pacVar15 = (char (*) [58])
             ((long)(this->m_VkWaitSemaphores).
                    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
  Args_1_01 = (char (*) [56])
              ((long)(this->m_WaitDstStageMasks).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_WaitDstStageMasks).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
  if ((char (*) [56])((long)pacVar15 >> 3) != Args_1_01) {
    FormatString<char[26],char[56]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size()",Args_1_01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x608);
    std::__cxx11::string::~string((string *)&msg);
    pacVar15 = (char (*) [58])
               ((long)(this->m_VkWaitSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
  Args_1_02 = (char (*) [58])
              ((long)(this->m_WaitSemaphoreValues).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_WaitSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if (pacVar15 != Args_1_02) {
    FormatString<char[26],char[58]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size()",Args_1_02)
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x609);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_1_03 = (char (*) [62])
              ((long)(this->m_SignalSemaphoreValues).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_SignalSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if ((char (*) [62])
      ((long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start) != Args_1_03) {
    FormatString<char[26],char[62]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size()",
               Args_1_03);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x60a);
    std::__cxx11::string::~string((string *)&msg);
  }
  puStack_6b0 = (undefined8 *)0x0;
  WaitSem = (VkSemaphore)0x4;
  uStack_690 = (ulong)((long)vkCmdBuffs.
                             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vkCmdBuffs.
                            super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  local_688 = vkCmdBuffs.
              super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  ppVVar7 = (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar18 = (ulong)((long)(this->m_VkWaitSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar7) >> 3;
  local_6a8 = uVar18 & 0xffffffff;
  local_698 = (pointer)0x0;
  ppVStack_6a0 = (pointer)0x0;
  if ((int)uVar18 != 0) {
    local_698 = (this->m_WaitDstStageMasks).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    ppVStack_6a0 = ppVVar7;
  }
  ppVVar7 = (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar16 = (ulong)((long)(this->m_VkSignalSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar7) >> 3;
  uStack_680 = uVar16 & 0xffffffff;
  local_678 = (pointer)0x0;
  if ((int)uVar16 != 0) {
    local_678 = ppVVar7;
  }
  local_618 = 0;
  puStack_610 = (pointer)0x0;
  local_628 = 0;
  puStack_620 = (pointer)0x0;
  local_638 = 0;
  uStack_630 = 0;
  if (bVar17) {
    puStack_610 = (pointer)0x0;
    puStack_6b0 = &local_638;
    local_638 = 0x3b9df29b;
    local_628 = uVar18 & 0xffffffff;
    puStack_620 = (pointer)0x0;
    if ((int)uVar18 != 0) {
      puStack_620 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    }
    local_618 = uVar16 & 0xffffffff;
    if ((int)uVar16 != 0) {
      puStack_610 = (this->m_SignalSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
  }
  pRVar8 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                     (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  Args_1_04 = pSignalFences;
  FenceValue = (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                *)RenderDeviceVkImpl::ExecuteCommandBuffer
                            (pRVar8,SVar13,(VkSubmitInfo *)&WaitSem,pSignalFences);
  pRVar8 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                     (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  this_02 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&pRVar8->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,SVar13);
  pRVar9 = (this->m_WaitRecycledSemaphores).
           super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_05 = (this->m_WaitRecycledSemaphores).
                 super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_05 != pRVar9; this_05 = this_05 + 1
      ) {
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    SetUnsignaled(this_05);
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
    DiscardResource<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
              (this_02,this_05,(Uint64)FenceValue);
  }
  std::
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
  ::clear(&this->m_WaitRecycledSemaphores);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::clear(local_660);
  puVar10 = (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar10) {
    (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar10;
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::clear(local_658);
  ppVVar7 = (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar7) {
    (this->m_VkWaitSemaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVVar7;
  }
  ppVVar7 = (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar7) {
    (this->m_VkSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar7;
  }
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::clear(pSignalFences);
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::clear(local_668);
  puVar11 = (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  puVar11 = (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar11;
  }
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    lVar22 = 0;
  }
  else {
    Args_1_04 = (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                 *)vkCmdBuffs.
                   super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (*vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_start != vkCmdBuff) {
      FormatString<char[26],char[34]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"vkCmdBuffs[buff_idx] == vkCmdBuff",
                 (char (*) [34])
                 vkCmdBuffs.
                 super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      Args_1_04 = (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                   *)0x63f;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x63f);
      std::__cxx11::string::~string((string *)&msg);
    }
    SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    DisposeCurrentCmdBuffer(this,SVar13,(Uint64)FenceValue);
    lVar22 = 1;
  }
  lVar19 = -lVar22;
  for (lVar21 = 0; pVVar1 = local_648, uVar12 << 3 != lVar21; lVar21 = lVar21 + 8) {
    this_03 = RefCntAutoPtr<Diligent::IDeviceContext>::RawPtr<Diligent::DeviceContextVkImpl>
                        ((RefCntAutoPtr<Diligent::IDeviceContext> *)
                         ((long)&(DeferredCtxs.
                                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_pObject + lVar21));
    SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    LOCK();
    paVar2 = &(this_03->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              m_SubmittedBuffersCmdQueueMask;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i | 1L << (SVar13.m_Value & 0x3f);
    UNLOCK();
    SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    Args_1_04 = FenceValue;
    DisposeVkCmdBuffer(this_03,SVar13,
                       *(VkCommandBuffer *)
                        ((long)vkCmdBuffs.
                               super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                        lVar21 + (ulong)(uint)((int)lVar22 << 3)),(Uint64)FenceValue);
    lVar19 = lVar19 + -1;
  }
  if (((long)vkCmdBuffs.
             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vkCmdBuffs.
             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) + lVar19 != 0) {
    FormatString<char[26],char[30]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"buff_idx == vkCmdBuffs.size()",(char (*) [30])Args_1_04);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x64d);
    std::__cxx11::string::~string((string *)&msg);
  }
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  lVar22 = 0;
  do {
    ResourceBindInfo::ResourceBindInfo((ResourceBindInfo *)((long)&msg._M_dataplus._M_p + lVar22));
    lVar22 = lVar22 + 0x1f0;
  } while (lVar22 != 0x5d0);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::operator=
            (&this->m_BindInfo,(array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL> *)&msg);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::~array
            ((array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL> *)&msg);
  VulkanUtilities::VulkanCommandBuffer::Reset(pVVar1);
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState,
             (PipelineStateVkImpl *)0x0);
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator=(local_650,(RenderPassVkImpl *)0x0);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer,
             (FramebufferVkImpl *)0x0);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::~vector(&DeferredCtxs);
  std::_Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~_Vector_base
            (&vkCmdBuffs.
              super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>);
  return;
}

Assistant:

void DeviceContextVkImpl::Flush(Uint32               NumCommandLists,
                                ICommandList* const* ppCommandLists)
{
    DEV_CHECK_ERR(!IsDeferred(), "Flush() should only be called for immediate contexts.");

    DEV_CHECK_ERR(m_ActiveQueriesCounter == 0,
                  "Flushing device context that has ", m_ActiveQueriesCounter,
                  " active queries. Vulkan requires that queries are begun and ended in the same command buffer.");

    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                  "Flushing device context inside an active render pass.");

    // TODO: replace with small_vector
    std::vector<VkCommandBuffer>               vkCmdBuffs;
    std::vector<RefCntAutoPtr<IDeviceContext>> DeferredCtxs;
    vkCmdBuffs.reserve(size_t{NumCommandLists} + 1);
    DeferredCtxs.reserve(size_t{NumCommandLists} + 1);

    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        if (m_pQueryMgr != nullptr)
        {
            VERIFY_EXPR(!IsDeferred());
            // Note that vkCmdResetQueryPool must be called outside of a render pass,
            // so it is better to reset all queries at once at the end of the command buffer.
            m_State.NumCommands += m_pQueryMgr->ResetStaleQueries(m_pDevice->GetLogicalDevice(), m_CommandBuffer);
        }

        if (m_State.NumCommands != 0)
        {
            EndRenderScope();

#ifdef DILIGENT_DEVELOPMENT
            DEV_CHECK_ERR(m_DvpDebugGroupCount == 0, "Not all debug groups have been ended");
            m_DvpDebugGroupCount = 0;
#endif

            m_CommandBuffer.FlushBarriers();
            m_CommandBuffer.EndCommandBuffer();

            vkCmdBuffs.push_back(vkCmdBuff);
        }
    }

    // Add command buffers from deferred contexts
    for (Uint32 i = 0; i < NumCommandLists; ++i)
    {
        CommandListVkImpl* pCmdListVk = ClassPtrCast<CommandListVkImpl>(ppCommandLists[i]);
        DEV_CHECK_ERR(pCmdListVk != nullptr, "Command list must not be null");
        DEV_CHECK_ERR(pCmdListVk->GetQueueId() == GetDesc().QueueId, "Command list recorded for QueueId ", pCmdListVk->GetQueueId(), ", but executed on QueueId ", GetDesc().QueueId, ".");
        DeferredCtxs.emplace_back();
        vkCmdBuffs.emplace_back();
        pCmdListVk->Close(DeferredCtxs.back(), vkCmdBuffs.back());
        VERIFY(vkCmdBuffs.back() != VK_NULL_HANDLE, "Trying to execute empty command buffer");
        VERIFY_EXPR(DeferredCtxs.back() != nullptr);
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size());

    bool UsedTimelineSemaphore = false;
    for (auto& val_fence : m_SignalFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(val_fence.first);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(val_fence.first);
    }

    for (auto& val_fence : m_WaitFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        pFenceVk->DvpDeviceWait(val_fence.first);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t i = 0; i < m_VkWaitSemaphores.size(); ++i)
            {
                if (m_VkWaitSemaphores[i] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", val_fence.first,
                                      ") is already added to wait operation with value (", m_WaitSemaphoreValues[i], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
            m_WaitSemaphoreValues.push_back(val_fence.first);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), val_fence.first))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size());
    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size());

    VkSubmitInfo SubmitInfo{};
    SubmitInfo.sType                = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    SubmitInfo.pNext                = nullptr;
    SubmitInfo.commandBufferCount   = static_cast<uint32_t>(vkCmdBuffs.size());
    SubmitInfo.pCommandBuffers      = vkCmdBuffs.data();
    SubmitInfo.waitSemaphoreCount   = static_cast<uint32_t>(m_VkWaitSemaphores.size());
    SubmitInfo.pWaitSemaphores      = SubmitInfo.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    SubmitInfo.pWaitDstStageMask    = SubmitInfo.waitSemaphoreCount != 0 ? m_WaitDstStageMasks.data() : nullptr;
    SubmitInfo.signalSemaphoreCount = static_cast<uint32_t>(m_VkSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = SubmitInfo.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        SubmitInfo.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = SubmitInfo.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = SubmitInfo.waitSemaphoreCount ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = SubmitInfo.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = SubmitInfo.signalSemaphoreCount ? m_SignalSemaphoreValues.data() : nullptr;
    }

    // Submit command buffer even if there are no commands to release stale resources.
    Uint64 SubmittedFenceValue = m_pDevice->ExecuteCommandBuffer(GetCommandQueueId(), SubmitInfo, &m_SignalFences);

    // Recycle semaphores
    {
        auto& ReleaseQueue = m_pDevice->GetReleaseQueue(GetCommandQueueId());
        for (auto& Sem : m_WaitRecycledSemaphores)
        {
            Sem.SetUnsignaled();
            ReleaseQueue.DiscardResource(std::move(Sem), SubmittedFenceValue);
        }
        m_WaitRecycledSemaphores.clear();
    }

    m_WaitManagedSemaphores.clear();
    m_WaitDstStageMasks.clear();
    m_SignalManagedSemaphores.clear();
    m_VkWaitSemaphores.clear();
    m_VkSignalSemaphores.clear();
    m_SignalFences.clear();
    m_WaitFences.clear();
    m_WaitSemaphoreValues.clear();
    m_SignalSemaphoreValues.clear();

    size_t buff_idx = 0;
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(vkCmdBuffs[buff_idx] == vkCmdBuff);
        DisposeCurrentCmdBuffer(GetCommandQueueId(), SubmittedFenceValue);
        ++buff_idx;
    }

    for (Uint32 i = 0; i < NumCommandLists; ++i, ++buff_idx)
    {
        DeviceContextVkImpl* pDeferredCtxVkImpl = DeferredCtxs[i].RawPtr<DeviceContextVkImpl>();
        // Set the bit in the deferred context cmd queue mask corresponding to cmd queue of this context
        pDeferredCtxVkImpl->UpdateSubmittedBuffersCmdQueueMask(GetCommandQueueId());
        // It is OK to dispose command buffer from another thread. We are not going to
        // record any commands and only need to add the buffer to the queue
        pDeferredCtxVkImpl->DisposeVkCmdBuffer(GetCommandQueueId(), std::move(vkCmdBuffs[buff_idx]), SubmittedFenceValue);
    }
    VERIFY_EXPR(buff_idx == vkCmdBuffs.size());

    m_State    = {};
    m_BindInfo = {};
    m_CommandBuffer.Reset();
    m_pPipelineState    = nullptr;
    m_pActiveRenderPass = nullptr;
    m_pBoundFramebuffer = nullptr;
}